

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Propagator.h
# Opt level: O1

string * __thiscall
jaegertracing::propagation::HTTPHeaderPropagator::normalizeKey
          (string *__return_storage_ptr__,HTTPHeaderPropagator *this,string *rawKey)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pcVar1 = (rawKey->_M_dataplus)._M_p;
  std::
  transform<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>,jaegertracing::propagation::HTTPHeaderPropagator::normalizeKey(std::__cxx11::string_const&)const::_lambda(char)_1_>
            (pcVar1,pcVar1 + rawKey->_M_string_length,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string normalizeKey(const std::string& rawKey) const override
    {
        std::string key;
        key.reserve(rawKey.size());
        std::transform(std::begin(rawKey),
                       std::end(rawKey),
                       std::back_inserter(key),
                       [](char ch) { return std::tolower(ch); });
        return key;
    }